

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

TaskSet * __thiscall
kj::_::NullableValue<kj::TaskSet>::emplace<kj::(anonymous_namespace)::ErrorHandlerImpl&>
          (NullableValue<kj::TaskSet> *this,ErrorHandlerImpl *params)

{
  ErrorHandlerImpl *params_00;
  ErrorHandlerImpl *params_local;
  NullableValue<kj::TaskSet> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::TaskSet>(&(this->field_1).value);
  }
  params_00 = fwd<kj::(anonymous_namespace)::ErrorHandlerImpl&>(params);
  ctor<kj::TaskSet,kj::(anonymous_namespace)::ErrorHandlerImpl&>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (TaskSet *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }